

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *cpi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  LAYER_CONTEXT *pLVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  MB_MODE_INFO_EXT_FRAME *pMVar9;
  int iVar10;
  int iVar11;
  int height;
  
  pLVar4 = (cpi->svc).layer_context;
  iVar8 = (cpi->svc).spatial_layer_id;
  iVar11 = (cpi->svc).temporal_layer_id;
  iVar10 = (cpi->svc).number_temporal_layers;
  iVar7 = iVar10 * iVar8 + iVar11;
  (cpi->svc).has_lower_quality_layer = 0;
  if (((0 < (long)iVar8) &&
      (iVar11 = (iVar8 + -1) * iVar10 + iVar11, pLVar4[iVar11].scaling_factor_den == 1)) &&
     (pLVar4[iVar11].scaling_factor_num == 1)) {
    (cpi->svc).has_lower_quality_layer = 1;
  }
  iVar11 = pLVar4[iVar7].scaling_factor_den;
  if (iVar11 == 0) {
    iVar10 = 0;
    height = 0;
  }
  else {
    iVar10 = (cpi->oxcf).frm_dim_cfg.width;
    height = (cpi->oxcf).frm_dim_cfg.height;
    iVar7 = pLVar4[iVar7].scaling_factor_num;
    if (iVar7 != 1 || iVar11 != 1) {
      uVar5 = (long)(iVar10 * iVar7) / (long)iVar11;
      uVar6 = (long)(height * iVar7) / (long)iVar11;
      iVar11 = (int)uVar5;
      iVar10 = iVar11 * 2 - ((int)((uVar5 & 0xffffffff) >> 0x1f) + iVar11 & 0xfffffffeU);
      iVar11 = (int)uVar6;
      height = iVar11 * 2 - (((uint)(uVar6 >> 0x1f) & 1) + iVar11 & 0xfffffffe);
    }
  }
  if (height * iVar10 < 0x12c01) {
    (cpi->svc).downsample_filter_type[iVar8] = EIGHTTAP_SMOOTH;
  }
  (cpi->common).width = iVar10;
  (cpi->common).height = height;
  iVar8 = av1_alloc_context_buffers
                    (&cpi->common,iVar10,height,(cpi->sf).part_sf.default_min_partition_size);
  if (iVar8 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers")
    ;
  }
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [(cpi->common).mi_params.mi_alloc_bsize];
    iVar8 = (int)((bVar3 - 1) + (cpi->common).mi_params.mi_cols) / (int)(uint)bVar3;
    iVar11 = ((int)((cpi->common).mi_params.mi_rows + (bVar3 - 1)) / (int)(uint)bVar3) * iVar8;
    if ((cpi->mbmi_ext_info).alloc_size < iVar11) {
      aom_free((cpi->mbmi_ext_info).frame_base);
      (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
      (cpi->mbmi_ext_info).alloc_size = 0;
      pMVar9 = (MB_MODE_INFO_EXT_FRAME *)aom_malloc((long)iVar11 * 0x54);
      (cpi->mbmi_ext_info).frame_base = pMVar9;
      if (pMVar9 == (MB_MODE_INFO_EXT_FRAME *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mbmi_ext_info->frame_base");
      }
      (cpi->mbmi_ext_info).alloc_size = iVar11;
    }
    (cpi->mbmi_ext_info).stride = iVar8;
  }
  av1_update_frame_size(cpi);
  if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
    uVar1 = (cpi->common).mi_params.mi_rows;
    uVar2 = (cpi->common).mi_params.mi_cols;
    (cpi->svc).mi_cols_full_resoln = uVar2;
    (cpi->svc).mi_rows_full_resoln = uVar1;
  }
  return;
}

Assistant:

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = NULL;
  int width = 0, height = 0;
  lc = &svc->layer_context[svc->spatial_layer_id * svc->number_temporal_layers +
                           svc->temporal_layer_id];
  // Set the lower quality layer flag.
  svc->has_lower_quality_layer = 0;
  if (cpi->svc.spatial_layer_id > 0) {
    const LAYER_CONTEXT *lc_prev =
        &svc->layer_context[(svc->spatial_layer_id - 1) *
                                svc->number_temporal_layers +
                            svc->temporal_layer_id];
    if (lc_prev->scaling_factor_den == 1 && lc_prev->scaling_factor_num == 1)
      svc->has_lower_quality_layer = 1;
  }
  av1_get_layer_resolution(cpi->oxcf.frm_dim_cfg.width,
                           cpi->oxcf.frm_dim_cfg.height, lc->scaling_factor_num,
                           lc->scaling_factor_den, &width, &height);
  // Use Eightap_smooth for low resolutions.
  if (width * height <= 320 * 240)
    svc->downsample_filter_type[svc->spatial_layer_id] = EIGHTTAP_SMOOTH;

  cm->width = width;
  cm->height = height;
  alloc_mb_mode_info_buffers(cpi);
  av1_update_frame_size(cpi);
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->mi_cols_full_resoln = cm->mi_params.mi_cols;
    svc->mi_rows_full_resoln = cm->mi_params.mi_rows;
  }
}